

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::UnitTestImpl::RecordProperty(UnitTestImpl *this,TestProperty *test_property)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestResult *this_00;
  string xml_element;
  string local_38;
  
  paVar1 = &local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)paVar1;
  if (this->current_test_info_ == (TestInfo *)0x0) {
    if (this->current_test_suite_ == (TestSuite *)0x0) {
      std::__cxx11::string::_M_replace((ulong)&local_38,0,(char *)0x0,0x19b14e);
      this_00 = &this->ad_hoc_test_result_;
    }
    else {
      std::__cxx11::string::_M_replace((ulong)&local_38,0,(char *)0x0,0x19b035);
      this_00 = &this->current_test_suite_->ad_hoc_test_result_;
    }
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_38,0,(char *)0x0,0x19b07a);
    this_00 = &this->current_test_info_->result_;
  }
  TestResult::RecordProperty(this_00,&local_38,test_property);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void UnitTestImpl::RecordProperty(const TestProperty& test_property) {
  std::string xml_element;
  TestResult* test_result;  // TestResult appropriate for property recording.

  if (current_test_info_ != nullptr) {
    xml_element = "testcase";
    test_result = &(current_test_info_->result_);
  } else if (current_test_suite_ != nullptr) {
    xml_element = "testsuite";
    test_result = &(current_test_suite_->ad_hoc_test_result_);
  } else {
    xml_element = "testsuites";
    test_result = &ad_hoc_test_result_;
  }
  test_result->RecordProperty(xml_element, test_property);
}